

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

err_t MATROSKA_LinkCuePointBlock(matroska_cuepoint *CuePoint,matroska_block *Block)

{
  ebml_context *Context;
  bool_t bVar1;
  matroska_block *local_18;
  
  local_18 = Block;
  Context = MATROSKA_getContextCuePoint();
  bVar1 = EBML_ElementIsType((ebml_element *)CuePoint,Context);
  if (bVar1 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)CuePoint, MATROSKA_getContextCuePoint())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x224,"err_t MATROSKA_LinkCuePointBlock(matroska_cuepoint *, matroska_block *)");
  }
  bVar1 = Node_IsPartOf(Block,0x4c424b4d);
  if (bVar1 != 0) {
    if (CuePoint != (matroska_cuepoint *)0x0) {
      (**(code **)((long)(CuePoint->Base).Base.Base.Base.VMT + 0x20))(CuePoint,0x101,&local_18,8);
      return 0;
    }
    __assert_fail("(const void*)(CuePoint)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x226,"err_t MATROSKA_LinkCuePointBlock(matroska_cuepoint *, matroska_block *)");
  }
  __assert_fail("Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x225,"err_t MATROSKA_LinkCuePointBlock(matroska_cuepoint *, matroska_block *)");
}

Assistant:

err_t MATROSKA_LinkCuePointBlock(matroska_cuepoint *CuePoint, matroska_block *Block)
{
    assert(EBML_ElementIsType((ebml_element*)CuePoint, MATROSKA_getContextCuePoint()));
    assert(Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS));
    Node_SET(CuePoint,MATROSKA_CUE_BLOCK,&Block);
    return ERR_NONE;
}